

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::emitLoad(TargetCodeGenerator *this,Value *value)

{
  FILE *__stream;
  bool bVar1;
  unsigned_short uVar2;
  LiteralType LVar3;
  ConstantBoolean *pCVar4;
  size_t sVar5;
  flow *pfVar6;
  StackPointer SVar7;
  undefined8 uVar8;
  StackPointer SVar9;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source_00;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source_01;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source_02;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_300;
  ConstantArray *local_288;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *local_270;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *local_258;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_230;
  ConstantString *local_220;
  ConstantValue<long,_(flow::LiteralType)2> *local_208;
  allocator<char> local_1e9;
  string local_1e8 [32];
  StackPointer local_1c8;
  StackPointer si;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_180;
  ConstantRegExp *re;
  vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<long,_std::allocator<long>_> local_130;
  ConstantArray *local_118;
  ConstantArray *array;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *local_c0;
  ConstantCidr *cidr;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *local_70;
  ConstantIP *ip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_38;
  ConstantString *str;
  ConstantBoolean *boolean;
  FlowNumber number;
  ConstantInt *integer;
  Value *value_local;
  TargetCodeGenerator *this_local;
  
  integer = (ConstantInt *)value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    local_208 = (ConstantValue<long,_(flow::LiteralType)2> *)0x0;
  }
  else {
    local_208 = (ConstantValue<long,_(flow::LiteralType)2> *)
                __dynamic_cast(value,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
  }
  number = (FlowNumber)local_208;
  if (local_208 == (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
    if (integer == (ConstantInt *)0x0) {
      local_220 = (ConstantString *)0x0;
    }
    else {
      local_220 = (ConstantString *)
                  __dynamic_cast(integer,&Value::typeinfo,
                                 &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    }
    str = local_220;
    if (local_220 == (ConstantString *)0x0) {
      if (integer == (ConstantInt *)0x0) {
        local_230 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                     *)0x0;
      }
      else {
        local_230 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                     *)__dynamic_cast(integer,&Value::typeinfo,
                                      &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                       typeinfo,0);
      }
      local_38 = local_230;
      if (local_230 ==
          (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
           *)0x0) {
        if (integer == (ConstantInt *)0x0) {
          local_258 = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0;
        }
        else {
          local_258 = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)
                      __dynamic_cast(integer,&Value::typeinfo,
                                     &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::
                                      typeinfo,0);
        }
        local_70 = local_258;
        if (local_258 == (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0) {
          if (integer == (ConstantInt *)0x0) {
            local_270 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0;
          }
          else {
            local_270 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)
                        __dynamic_cast(integer,&Value::typeinfo,
                                       &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::
                                        typeinfo,0);
          }
          local_c0 = local_270;
          if (local_270 == (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0) {
            if (integer == (ConstantInt *)0x0) {
              local_288 = (ConstantArray *)0x0;
            }
            else {
              local_288 = (ConstantArray *)
                          __dynamic_cast(integer,&Value::typeinfo,&ConstantArray::typeinfo,0);
            }
            local_118 = local_288;
            if (local_288 == (ConstantArray *)0x0) {
              if (integer == (ConstantInt *)0x0) {
                local_300 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0;
              }
              else {
                local_300 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)
                            __dynamic_cast(integer,&Value::typeinfo,
                                           &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::
                                            typeinfo,0);
              }
              local_180 = local_300;
              if (local_300 == (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0) {
                SVar7 = getStackPointer(this,(Value *)integer);
                __stream = _stderr;
                local_1c8 = SVar7;
                if (SVar7 == 0xffffffffffffffff) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_1e8,
                             "BUG: emitLoad: value not yet on the stack but referenced as operand.",
                             &local_1e9);
                  uVar8 = std::__cxx11::string::c_str();
                  fprintf(__stream,"%s\n",uVar8);
                  std::__cxx11::string::~string(local_1e8);
                  std::allocator<char>::~allocator(&local_1e9);
                  abort();
                }
                SVar9 = getStackPointer(this);
                if (SVar7 != SVar9 - 1) {
                  sVar5 = Value::useCount((Value *)integer);
                  if (sVar5 == 1) {
                    emitInstr(this,STACKROT,(Operand)local_1c8);
                  }
                  else {
                    emitInstr(this,LOAD,(Operand)local_1c8);
                    push(this,(Value *)integer);
                  }
                }
              }
              else {
                ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>::get
                          ((RegExp *)&si,local_300);
                sVar5 = ConstantPool::makeRegExp(&this->cp_,(RegExp *)&si);
                emitInstr(this,ILOAD,(Operand)sVar5);
                util::RegExp::~RegExp((RegExp *)&si);
                changeStack(this,0,(Value *)integer);
              }
            }
            else {
              LVar3 = Value::type((Value *)local_288);
              switch(LVar3) {
              case IntArray:
                pfVar6 = (flow *)ConstantArray::get(local_118);
                convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
                          (&local_130,pfVar6,source);
                sVar5 = ConstantPool::makeIntegerArray(&this->cp_,&local_130);
                emitInstr(this,ITLOAD,(Operand)sVar5);
                std::vector<long,_std::allocator<long>_>::~vector(&local_130);
                changeStack(this,0,(Value *)integer);
                break;
              case StringArray:
                pfVar6 = (flow *)ConstantArray::get(local_118);
                convert<std::__cxx11::string,flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>
                          (&local_148,pfVar6,source_00);
                sVar5 = ConstantPool::makeStringArray(&this->cp_,&local_148);
                emitInstr(this,STLOAD,(Operand)sVar5);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_148);
                changeStack(this,0,(Value *)integer);
                break;
              case IPAddrArray:
                pfVar6 = (flow *)ConstantArray::get(local_118);
                convert<flow::util::IPAddress,flow::ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>>
                          (&local_160,pfVar6,source_01);
                sVar5 = ConstantPool::makeIPaddrArray(&this->cp_,&local_160);
                emitInstr(this,PTLOAD,(Operand)sVar5);
                std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::~vector
                          (&local_160);
                changeStack(this,0,(Value *)integer);
                break;
              case CidrArray:
                pfVar6 = (flow *)ConstantArray::get(local_118);
                convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
                          ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)&re,pfVar6
                           ,source_02);
                sVar5 = ConstantPool::makeCidrArray
                                  (&this->cp_,
                                   (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)
                                   &re);
                emitInstr(this,CTLOAD,(Operand)sVar5);
                std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::~vector
                          ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)&re);
                changeStack(this,0,(Value *)integer);
                break;
              default:
                fprintf(_stderr,"BUG: Unsupported array type in target code generator.");
                abort();
              }
            }
          }
          else {
            ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>::get((Cidr *)&array,local_270);
            sVar5 = ConstantPool::makeCidr(&this->cp_,(Cidr *)&array);
            emitInstr(this,CLOAD,(Operand)sVar5);
            changeStack(this,0,(Value *)integer);
          }
        }
        else {
          ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>::get
                    ((IPAddress *)((long)&cidr + 4),local_258);
          sVar5 = ConstantPool::makeIPAddress(&this->cp_,(IPAddress *)((long)&cidr + 4));
          emitInstr(this,PLOAD,(Operand)sVar5);
          changeStack(this,0,(Value *)integer);
        }
      }
      else {
        ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
        ::get(&local_58,local_230);
        sVar5 = ConstantPool::makeString(&this->cp_,&local_58);
        emitInstr(this,SLOAD,(Operand)sVar5);
        std::__cxx11::string::~string((string *)&local_58);
        changeStack(this,0,(Value *)integer);
      }
    }
    else {
      bVar1 = ConstantValue<bool,_(flow::LiteralType)1>::get
                        ((ConstantValue<bool,_(flow::LiteralType)1> *)local_220);
      emitInstr(this,ILOAD,(ushort)bVar1);
      changeStack(this,0,(Value *)integer);
    }
  }
  else {
    pCVar4 = (ConstantBoolean *)ConstantValue<long,_(flow::LiteralType)2>::get(local_208);
    boolean = pCVar4;
    uVar2 = std::numeric_limits<unsigned_short>::max();
    if ((long)(ulong)uVar2 < (long)pCVar4) {
      sVar5 = ConstantPool::makeInteger(&this->cp_,(FlowNumber)boolean);
      emitInstr(this,NLOAD,(Operand)sVar5);
      changeStack(this,0,(Value *)integer);
    }
    else {
      emitInstr(this,ILOAD,(Operand)boolean);
      changeStack(this,0,(Value *)integer);
    }
  }
  return;
}

Assistant:

void TargetCodeGenerator::emitLoad(Value* value) {
  // const int
  if (auto integer = dynamic_cast<ConstantInt*>(value)) {
    // FIXME this constant initialization should pretty much be done in the entry block
    FlowNumber number = integer->get();
    if (number <= std::numeric_limits<Operand>::max()) {
      emitInstr(Opcode::ILOAD, number);
      changeStack(0, value);
    } else {
      emitInstr(Opcode::NLOAD, cp_.makeInteger(number));
      changeStack(0, value);
    }
    return;
  }

  // const boolean
  if (auto boolean = dynamic_cast<ConstantBoolean*>(value)) {
    emitInstr(Opcode::ILOAD, boolean->get());
    changeStack(0, value);
    return;
  }

  // const string
  if (auto str = dynamic_cast<ConstantString*>(value)) {
    emitInstr(Opcode::SLOAD, cp_.makeString(str->get()));
    changeStack(0, value);
    return;
  }

  // const ip
  if (auto ip = dynamic_cast<ConstantIP*>(value)) {
    emitInstr(Opcode::PLOAD, cp_.makeIPAddress(ip->get()));
    changeStack(0, value);
    return;
  }

  // const cidr
  if (auto cidr = dynamic_cast<ConstantCidr*>(value)) {
    emitInstr(Opcode::CLOAD, cp_.makeCidr(cidr->get()));
    changeStack(0, value);
    return;
  }

  // const array<T>
  if (auto array = dynamic_cast<ConstantArray*>(value)) {
    switch (array->type()) {
      case LiteralType::IntArray:
        emitInstr(Opcode::ITLOAD,
             cp_.makeIntegerArray(
                 convert<FlowNumber, ConstantInt>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::StringArray:
        emitInstr(Opcode::STLOAD,
             cp_.makeStringArray(
                 convert<std::string, ConstantString>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::IPAddrArray:
        emitInstr(Opcode::PTLOAD,
             cp_.makeIPaddrArray(convert<util::IPAddress, ConstantIP>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::CidrArray:
        emitInstr(Opcode::CTLOAD,
             cp_.makeCidrArray(convert<util::Cidr, ConstantCidr>(array->get())));
        changeStack(0, value);
        break;
      default:
        fprintf(stderr, "BUG: Unsupported array type in target code generator.");
        abort();
    }
    return;
  }

  // const regex
  if (auto re = dynamic_cast<ConstantRegExp*>(value)) {
    // TODO emitInstr(Opcode::RLOAD, re->get());
    emitInstr(Opcode::ILOAD, cp_.makeRegExp(re->get()));
    changeStack(0, value);
    return;
  }

  // if value is already on stack, dup to top
  StackPointer si = getStackPointer(value);
  FLOW_ASSERT(si != static_cast<size_t>(-1),
              "BUG: emitLoad: value not yet on the stack but referenced as operand.");

  if (si == getStackPointer() - 1)
    return;

  if (value->useCount() == 1) {
    // XXX only used once, so move value to stack top
    emitInstr(Opcode::STACKROT, si);
    return;
  }

  // XXX duplicate value onto stack top
  emitInstr(Opcode::LOAD, si);
  push(value);
}